

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O0

void __thiscall Circuit::sort(Circuit *this,bool test)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  ostream *poVar6;
  Circuit *pCVar7;
  void *this_00;
  reference pvVar8;
  vector<bool,_std::allocator<bool>_> *pvVar9;
  byte in_SIL;
  uint *in_RDI;
  reference rVar10;
  reference rVar11;
  uint j_2;
  uint j_1;
  uint i_2;
  uint j;
  uint i_1;
  uint cnt;
  uint i;
  vector<bool,_std::allocator<bool>_> used;
  allocator_type *in_stack_fffffffffffffed0;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffed8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffee0;
  Circuit *in_stack_fffffffffffffee8;
  Circuit *in_stack_fffffffffffffef0;
  uint uVar12;
  _Bit_type in_stack_ffffffffffffff38;
  _Bit_type *in_stack_ffffffffffffff40;
  reference local_a0;
  uint local_8c;
  uint local_88;
  uint local_84;
  reference local_80;
  uint local_6c;
  uint local_68;
  int local_64;
  reference local_60;
  uint local_50;
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::allocator<bool>::allocator((allocator<bool> *)0x10a94a);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0);
  std::allocator<bool>::~allocator((allocator<bool> *)0x10a976);
  rVar10._M_mask = in_stack_ffffffffffffff38;
  rVar10._M_p = in_stack_ffffffffffffff40;
  for (local_50 = 0; local_50 < *in_RDI; local_50 = local_50 + 1) {
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef0,
                        (size_type)in_stack_fffffffffffffee8);
    local_60 = rVar10;
    std::_Bit_reference::operator=(&local_60,false);
  }
  local_64 = 0;
  local_68 = 0;
  while( true ) {
    uVar2 = (ulong)local_68;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2));
    if (sVar3 <= uVar2) break;
    local_6c = 0;
    while( true ) {
      uVar12 = local_6c;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                          (ulong)local_68);
      if (*pvVar4 <= uVar12) break;
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef0,
                          (size_type)in_stack_fffffffffffffee8);
      local_80 = rVar11;
      std::_Bit_reference::operator=(&local_80,true);
      local_64 = local_64 + 1;
      local_6c = local_6c + 1;
    }
    local_68 = local_68 + 1;
  }
  local_84 = 0;
  do {
    uVar5 = (ulong)local_84;
    sVar3 = std::vector<GateType,_std::allocator<GateType>_>::size
                      ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe));
    if (sVar3 <= uVar5) {
      recompute_map(in_stack_fffffffffffffef0);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x10ae26);
      return;
    }
    local_88 = local_84;
    if ((local_9 & 1) != 0) {
      bVar1 = gate_is_ok(in_stack_fffffffffffffee8,(uint)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         in_stack_fffffffffffffed8);
      if (!bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Problem in topological sort");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        abort();
      }
    }
    while( true ) {
      bVar1 = gate_is_ok(in_stack_fffffffffffffee8,(uint)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         in_stack_fffffffffffffed8);
      if (bVar1) break;
      local_88 = local_88 + 1;
      in_stack_fffffffffffffef0 = (Circuit *)(ulong)local_88;
      pCVar7 = (Circuit *)
               std::vector<GateType,_std::allocator<GateType>_>::size
                         ((vector<GateType,_std::allocator<GateType>_> *)(in_RDI + 0xe));
      uVar12 = (uint)(uVar2 >> 0x20);
      if (in_stack_fffffffffffffef0 == pCVar7) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Problem in conversion with (current) gate ")
        ;
        this_00 = (void *)std::ostream::operator<<(poVar6,local_84);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        output_gate((Circuit *)rVar10._M_p,(ostream *)rVar10._M_mask,uVar12);
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        abort();
      }
    }
    if (local_84 != local_88) {
      swap_gate(in_stack_fffffffffffffef0,(uint)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                (uint)in_stack_fffffffffffffee8);
    }
    local_8c = 0;
    while( true ) {
      in_stack_fffffffffffffed8 = (vector<bool,_std::allocator<bool>_> *)(ulong)local_8c;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(in_RDI + 0x1a),(ulong)local_84);
      pvVar9 = (vector<bool,_std::allocator<bool>_> *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar8);
      if (pvVar9 <= in_stack_fffffffffffffed8) break;
      pvVar8 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)(in_RDI + 0x1a),(ulong)local_84);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar8,(ulong)local_8c);
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffef0,
                          (size_type)in_stack_fffffffffffffee8);
      local_a0 = rVar11;
      std::_Bit_reference::operator=(&local_a0,true);
      local_8c = local_8c + 1;
    }
    local_84 = local_84 + 1;
  } while( true );
}

Assistant:

void Circuit::sort(bool test) {
  vector<bool> used(nWires);
  for (unsigned int i = 0; i < nWires; i++) {
    used[i] = false;
  }

  // Define inputs
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < numI.size(); i++) {
    for (unsigned int j = 0; j < numI[i]; j++) {
      used[cnt] = true;
      cnt++;
    }
  }

  // Now go through each gate and work out if defined inputs or not
  for (unsigned int i = 0; i < GateT.size(); i++) { // Find next ok gate
    unsigned int j = i;
    if (test && gate_is_ok(i, used) == false) {
      cout << "Problem in topological sort" << endl;
      abort();
    } else {
      while (gate_is_ok(j, used) == false) {
        j++;
        if (j == GateT.size()) {
          cout << "Problem in conversion with (current) gate " << i << endl;
          output_gate(cout, i);
          cout << endl;
          abort();
        }
      }
      // Swap gate i and gate j if i<>j
      if (i != j) {
        swap_gate(i, j);
      }
    }
    // Set output wires to be OK
    for (unsigned int j = 0; j < GateO[i].size(); j++) {
      used[GateO[i][j]] = true;
    }
  }
  recompute_map();
}